

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

int __thiscall RenX::Server::sendWarnMessage(Server *this,PlayerInfo *player,string_view message)

{
  int iVar1;
  char *pcVar2;
  string_view text;
  string_view str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pcVar2 = message._M_str;
  s_abi_cxx11_(&local_80,"cwarn pid",9);
  string_printf_abi_cxx11_(&local_a0,"%d ",(ulong)(uint)player->id);
  std::operator+(&local_60,&local_80,&local_a0);
  str._M_str = pcVar2;
  str._M_len = (size_t)message._M_str;
  escapifyRCON_abi_cxx11_(&local_c0,(RenX *)message._M_len,str);
  std::operator+(&local_40,&local_60,&local_c0);
  std::operator+(&local_e0,&local_40,'\n');
  text._M_str = local_e0._M_dataplus._M_p;
  text._M_len = local_e0._M_string_length;
  iVar1 = sendSocket(this,text);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  return iVar1;
}

Assistant:

int RenX::Server::sendWarnMessage(const RenX::PlayerInfo &player, std::string_view message) {
	return sendSocket("cwarn pid"s + string_printf("%d ", player.id) + RenX::escapifyRCON(message) + '\n');
}